

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O3

float64 helper_recpe_f64_aarch64(float64 input,void *fpstp)

{
  _Bool _Var1;
  undefined4 in_EAX;
  uint uVar2;
  int iVar3;
  float64 fVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int f64_exp;
  undefined8 uStack_28;
  
  uVar7 = 0x7ff0000000000000;
  uStack_28._0_4_ = in_EAX;
  fVar4 = float64_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  uVar2 = (uint)(fVar4 >> 0x34);
  uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28) & 0x7ffffffffff;
  uVar6 = fVar4 & 0x7fffffffffffffff;
  if (uVar6 < 0x7ff0000000000001) {
    uVar8 = fVar4 & 0x8000000000000000;
    if (uVar6 != 0x7ff0000000000000) {
      if (uVar6 == 0) {
        float_raise_aarch64('\x04',(float_status *)fpstp);
      }
      else {
        if ((fVar4 & 0x7ffc000000000000) != 0) {
          if ((0x7fc < (uVar2 & 0x7ff)) && (*(char *)((long)fpstp + 4) != '\0')) {
            float_raise_aarch64('\x10',(float_status *)fpstp);
            return uVar8;
          }
          uVar5 = call_recip_estimate((int *)((long)&uStack_28 + 4),0x7fd,fVar4 & 0xfffffffffffff);
          return uVar8 | uVar5 & 0xfffffffffffff | (ulong)(uStack_28._4_4_ & 0x7ff) << 0x34;
        }
        float_raise_aarch64('(',(float_status *)fpstp);
        _Var1 = round_to_inf((float_status *)(ulong)*(byte *)((long)fpstp + 1),
                             SUB81(fVar4 >> 0x3f,0));
        if (_Var1) {
          return uVar8 | 0x7ff0000000000000;
        }
        uVar7 = 0x7fefffffffffffff;
      }
      uVar8 = fVar4 | uVar7;
    }
  }
  else {
    iVar3 = float64_is_signaling_nan_aarch64(fVar4,(float_status *)fpstp);
    if (iVar3 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      fVar4 = float64_silence_nan_aarch64(fVar4,(float_status *)fpstp);
    }
    uVar8 = fVar4;
    if (*(char *)((long)fpstp + 6) != '\0') {
      fVar4 = float64_default_nan_aarch64((float_status *)fpstp);
      return fVar4;
    }
  }
  return uVar8;
}

Assistant:

float64 HELPER(recpe_f64)(float64 input, void *fpstp)
{
    float_status *fpst = fpstp;
    float64 f64 = float64_squash_input_denormal(input, fpst);
    uint64_t f64_val = float64_val(f64);
    bool f64_sign = float64_is_neg(f64);
    int f64_exp = extract64(f64_val, 52, 11);
    uint64_t f64_frac = extract64(f64_val, 0, 52);

    /* Deal with any special cases */
    if (float64_is_any_nan(f64)) {
        float64 nan = f64;
        if (float64_is_signaling_nan(f64, fpst)) {
            float_raise(float_flag_invalid, fpst);
            nan = float64_silence_nan(f64, fpst);
        }
        if (fpst->default_nan_mode) {
            nan =  float64_default_nan(fpst);
        }
        return nan;
    } else if (float64_is_infinity(f64)) {
        return float64_set_sign(float64_zero, float64_is_neg(f64));
    } else if (float64_is_zero(f64)) {
        float_raise(float_flag_divbyzero, fpst);
        return float64_set_sign(float64_infinity, float64_is_neg(f64));
    } else if ((f64_val & ~(1ULL << 63)) < (1ULL << 50)) {
        /* Abs(value) < 2.0^-1024 */
        float_raise(float_flag_overflow | float_flag_inexact, fpst);
        if (round_to_inf(fpst, f64_sign)) {
            return float64_set_sign(float64_infinity, f64_sign);
        } else {
            return float64_set_sign(float64_maxnorm, f64_sign);
        }
    } else if (f64_exp >= 2045 && fpst->flush_to_zero) {
        float_raise(float_flag_underflow, fpst);
        return float64_set_sign(float64_zero, float64_is_neg(f64));
    }

    f64_frac = call_recip_estimate(&f64_exp, 2045, f64_frac);

    /* result = sign : result_exp<10:0> : fraction<51:0>; */
    f64_val = deposit64(0, 63, 1, f64_sign);
    f64_val = deposit64(f64_val, 52, 11, f64_exp);
    f64_val = deposit64(f64_val, 0, 52, f64_frac);
    return make_float64(f64_val);
}